

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool __thiscall testing::internal::UnitTestImpl::RunAllTests(UnitTestImpl *this)

{
  InternalRunDeathTestFlag *pIVar1;
  TestEventRepeater *pTVar2;
  pointer ppTVar3;
  pointer piVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  pointer ppTVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  pointer ppEVar15;
  long lVar16;
  __normal_iterator<testing::Environment_**,_std::vector<testing::Environment_*,_std::allocator<testing::Environment_*>_>_>
  __tmp;
  pointer ppEVar17;
  timeval now;
  timeval local_48;
  long local_38;
  
  if (g_init_gtest_count == 0) {
    puts(
        "\nThis test program did NOT call ::testing::InitGoogleTest before calling RUN_ALL_TESTS().  Please fix it."
        );
    bVar6 = false;
  }
  else {
    bVar6 = true;
    if (g_help_flag == '\0') {
      PostFlagParsingInit(this);
      WriteToShardStatusFileIfNeeded();
      pIVar1 = (this->internal_run_death_test_flag_).ptr_;
      bVar5 = ShouldShard("GTEST_TOTAL_SHARDS","GTEST_SHARD_INDEX",
                          pIVar1 != (InternalRunDeathTestFlag *)0x0);
      iVar7 = FilterTests(this,(uint)!bVar5);
      if (FLAGS_gtest_list_tests == '\x01') {
        ListTestsMatchingFilter(this);
      }
      else {
        iVar9 = 0;
        if (FLAGS_gtest_shuffle == '\x01') {
          iVar9 = FLAGS_gtest_random_seed;
          if (FLAGS_gtest_random_seed == 0) {
            gettimeofday(&local_48,(__timezone_ptr_t)0x0);
            iVar9 = ((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_48.tv_usec),8) >> 7) -
                    (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_48.tv_usec),0xc) >> 0x1f)) +
                    (int)local_48.tv_sec * 1000;
          }
          iVar9 = (iVar9 - 1U) % 99999 + 1;
        }
        this->random_seed_ = iVar9;
        pTVar2 = (this->listeners_).repeater_;
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[2])(pTVar2);
        uVar10 = 1;
        if (pIVar1 == (InternalRunDeathTestFlag *)0x0) {
          uVar10 = FLAGS_gtest_repeat;
        }
        if (uVar10 == 0) {
          bVar6 = true;
        }
        else {
          uVar14 = 0;
          bVar12 = 0;
          do {
            ppTVar3 = (this->test_cases_).
                      super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            for (ppTVar8 = (this->test_cases_).
                           super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                           ._M_impl.super__Vector_impl_data._M_start; ppTVar8 != ppTVar3;
                ppTVar8 = ppTVar8 + 1) {
              TestCase::ClearResult(*ppTVar8);
            }
            gettimeofday(&local_48,(__timezone_ptr_t)0x0);
            lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_usec),8);
            local_38 = CONCAT44(local_48.tv_sec._4_4_,(int)local_48.tv_sec);
            if (iVar7 < 1) {
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                        (pTVar2,this->parent_,uVar14);
            }
            else {
              if (FLAGS_gtest_shuffle == '\x01') {
                (this->random_).state_ = this->random_seed_;
                ShuffleTests(this);
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[3])
                        (pTVar2,this->parent_,uVar14);
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[4])(pTVar2,this->parent_);
              ppEVar17 = (this->environments_).
                         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              for (ppEVar15 = (this->environments_).
                              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppEVar15 != ppEVar17;
                  ppEVar15 = ppEVar15 + 1) {
                (**(code **)(*(long *)*ppEVar15 + 0x10))();
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[5])(pTVar2,this->parent_);
              bVar6 = Test::HasFatalFailure();
              if ((!bVar6) &&
                 (ppTVar8 = (this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                 0 < (int)((ulong)((long)(this->test_cases_).
                                         super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar8)
                          >> 3))) {
                lVar16 = 0;
                do {
                  piVar4 = (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  uVar13 = 0xffffffff;
                  if (lVar16 < (int)((ulong)((long)(this->test_case_indices_).
                                                   super__Vector_base<int,_std::allocator<int>_>.
                                                   _M_impl.super__Vector_impl_data._M_finish -
                                            (long)piVar4) >> 2)) {
                    uVar13 = piVar4[lVar16];
                  }
                  TestCase::Run(ppTVar8[uVar13]);
                  lVar16 = lVar16 + 1;
                  ppTVar8 = (this->test_cases_).
                            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                } while (lVar16 < (int)((ulong)((long)(this->test_cases_).
                                                                                                            
                                                  super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)ppTVar8) >> 3));
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xb])
                        (pTVar2,this->parent_);
              ppEVar15 = (this->environments_).
                         super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              for (ppEVar17 = (this->environments_).
                              super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish; ppEVar17 != ppEVar15;
                  ppEVar17 = ppEVar17 + -1) {
                (**(code **)(*(long *)ppEVar17[-1] + 0x18))();
              }
              (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xc])(pTVar2);
            }
            gettimeofday(&local_48,(__timezone_ptr_t)0x0);
            this->elapsed_time_ =
                 (CONCAT44(local_48.tv_sec._4_4_,(int)local_48.tv_sec) - local_38) * 1000 +
                 local_48.tv_usec / 1000 + ((lVar11 >> 7) - (lVar11 >> 0x3f));
            (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xd])
                      (pTVar2,this->parent_,uVar14);
            bVar6 = Passed(this);
            if (!bVar6) {
              bVar12 = 1;
            }
            UnshuffleTests(this);
            if (FLAGS_gtest_shuffle == '\x01') {
              iVar9 = GetNextRandomSeed(this->random_seed_);
              this->random_seed_ = iVar9;
            }
            uVar13 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar13;
          } while (uVar13 != uVar10 || (int)uVar10 < 0);
          bVar6 = (bool)(bVar12 ^ 1);
        }
        (*(pTVar2->super_TestEventListener)._vptr_TestEventListener[0xe])(pTVar2,this->parent_);
      }
    }
  }
  return bVar6;
}

Assistant:

static bool GTestIsInitialized() { return g_init_gtest_count != 0; }